

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleCharString.cpp
# Opt level: O1

SingleCharString * Js::SingleCharString::New(char16 ch,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  SingleCharString *this;
  StaticType *type;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SingleCharString.cpp"
                                ,0x17,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_8ebe61c;
  data.filename._0_4_ = 0x1a;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_48);
  this = (SingleCharString *)new<Memory::Recycler>(0x20,alloc,0x38bbb2);
  type = StringCache::GetStringTypeStatic
                   (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  SingleCharString(this,ch,type);
  return this;
}

Assistant:

SingleCharString* SingleCharString::New(char16 ch, ScriptContext* scriptContext)
    {
        Assert(scriptContext != nullptr);

        return RecyclerNew(scriptContext->GetRecycler(),SingleCharString,ch,
            scriptContext->GetLibrary()->GetStringTypeStatic());
    }